

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void cpool_remove_conn(cpool *cpool,connectdata *conn)

{
  undefined1 *puVar1;
  cpool_bundle *pcVar2;
  cpool_bundle *list;
  size_t sVar3;
  Curl_hash_element *pCVar4;
  Curl_hash_iterator iter;
  Curl_hash_iterator local_40;
  
  pcVar2 = (cpool_bundle *)Curl_node_llist(&conn->cpool_node);
  if (pcVar2 != (cpool_bundle *)0x0) {
    list = cpool_find_bundle(cpool,conn);
    if (pcVar2 == list) {
      Curl_node_remove(&conn->cpool_node);
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 & 0xfd;
      sVar3 = Curl_llist_count(&list->conns);
      if (sVar3 == 0) {
        Curl_hash_start_iterate(&cpool->dest2bundle,&local_40);
        do {
          pCVar4 = Curl_hash_next_element(&local_40);
          if (pCVar4 == (Curl_hash_element *)0x0) goto LAB_00119090;
        } while ((cpool_bundle *)pCVar4->ptr != pcVar2);
        Curl_hash_delete(&cpool->dest2bundle,pCVar4->key,pCVar4->key_len);
      }
LAB_00119090:
      conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffdffffffff);
      cpool->num_conn = cpool->num_conn - 1;
    }
  }
  return;
}

Assistant:

static void cpool_remove_conn(struct cpool *cpool,
                              struct connectdata *conn)
{
  struct Curl_llist *list = Curl_node_llist(&conn->cpool_node);
  DEBUGASSERT(cpool);
  if(list) {
    /* The connection is certainly in the pool, but where? */
    struct cpool_bundle *bundle = cpool_find_bundle(cpool, conn);
    if(bundle && (list == &bundle->conns)) {
      cpool_bundle_remove(bundle, conn);
      if(!Curl_llist_count(&bundle->conns))
        cpool_remove_bundle(cpool, bundle);
      conn->bits.in_cpool = FALSE;
      cpool->num_conn--;
    }
    else {
      /* Not in  a bundle, already in the shutdown list? */
      DEBUGASSERT(list == &cpool->shutdowns);
    }
  }
}